

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnMemoryInitExpr
          (ExprVisitorDelegate *this,MemoryInitExpr *expr)

{
  WatWriter *pWVar1;
  NextChar next_char;
  Info local_68;
  
  pWVar1 = this->writer_;
  Opcode::GetInfo(&local_68,(Opcode *)&Opcode::MemoryInit_Opcode);
  WritePuts(pWVar1,local_68.name,Space);
  WriteVar(this->writer_,&expr->var,Space);
  WriteMemoryVarUnlessZero
            (this->writer_,&(expr->super_MemoryExpr<(wabt::ExprType)32>).memidx,next_char);
  pWVar1 = this->writer_;
  if (pWVar1->next_char_ == ForceNewline) {
    WriteNextChar(pWVar1);
  }
  pWVar1->next_char_ = Newline;
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnMemoryInitExpr(MemoryInitExpr* expr) {
  writer_->WritePutsSpace(Opcode::MemoryInit_Opcode.GetName());
  writer_->WriteVar(expr->var, NextChar::Space);
  writer_->WriteMemoryVarUnlessZero(expr->memidx, NextChar::Space);
  writer_->WriteNewline(NO_FORCE_NEWLINE);
  return Result::Ok;
}